

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O0

REF_STATUS ref_swap_same_faceid(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reib_bi;
  REF_LONG ref_private_status_reib_ai;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL has_qua;
  REF_BOOL has_tri;
  REF_BOOL has_edg;
  REF_INT id1;
  REF_INT id0;
  REF_INT nodes [27];
  REF_INT cell_to_swap [2];
  REF_INT ncell;
  REF_CELL ref_cell;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  unique0x00012000 = ref_grid->cell[3];
  *allowed = 0;
  ref_grid_local._4_4_ = ref_cell_has_side(ref_grid->cell[0],node0,node1,&has_qua);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ =
         ref_cell_has_side(ref_grid->cell[3],node0,node1,&ref_private_macro_code_rss);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ =
           ref_cell_has_side(ref_grid->cell[6],node0,node1,&ref_private_macro_code_rss_1);
      if (ref_grid_local._4_4_ == 0) {
        if ((has_qua == 0) &&
           ((ref_private_macro_code_rss == 0 || (ref_private_macro_code_rss_1 == 0)))) {
          ref_grid_local._4_4_ =
               ref_cell_list_with2(stack0xffffffffffffffd0,node0,node1,2,cell_to_swap,nodes + 0x19);
          if (ref_grid_local._4_4_ == 0) {
            if (cell_to_swap[0] == 0) {
              *allowed = 1;
              ref_grid_local._4_4_ = 0;
            }
            else if ((long)cell_to_swap[0] == 2) {
              ref_grid_local._4_4_ = ref_cell_nodes(stack0xffffffffffffffd0,nodes[0x19],&id1);
              if (ref_grid_local._4_4_ == 0) {
                has_edg = (&id1)[stack0xffffffffffffffd0->node_per];
                ref_grid_local._4_4_ = ref_cell_nodes(stack0xffffffffffffffd0,nodes[0x1a],&id1);
                if (ref_grid_local._4_4_ == 0) {
                  if (has_edg == (&id1)[stack0xffffffffffffffd0->node_per]) {
                    *allowed = 1;
                    ref_grid_local._4_4_ = 0;
                  }
                  else {
                    ref_grid_local._4_4_ = 0;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                         ,0x171,"ref_swap_same_faceid",(ulong)ref_grid_local._4_4_,"nodes tri1");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                       ,0x16f,"ref_swap_same_faceid",(ulong)ref_grid_local._4_4_,"nodes tri0");
              }
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                     ,0x16d,"ref_swap_same_faceid",
                     "there should be zero or two triangles for manifold",2,(long)cell_to_swap[0]);
              ref_node_location(ref_grid->node,node0);
              ref_node_location(ref_grid->node,node1);
              ref_export_by_extension(ref_grid,"ref_swap_same_faceid.tec");
              ref_grid_local._4_4_ = 1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x163,"ref_swap_same_faceid",(ulong)ref_grid_local._4_4_,"more then two");
            ref_node_location(ref_grid->node,node0);
            ref_node_location(ref_grid->node,node1);
            ref_swap_tattle_nodes(stack0xffffffffffffffd0,node0,node1);
            ref_export_by_extension(ref_grid,"ref_swap_same_faceid.tec");
          }
        }
        else {
          *allowed = 0;
          ref_grid_local._4_4_ = 0;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x158,"ref_swap_same_faceid",(ulong)ref_grid_local._4_4_,"qua side");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x156,
             "ref_swap_same_faceid",(ulong)ref_grid_local._4_4_,"tri side");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x154,
           "ref_swap_same_faceid",(ulong)ref_grid_local._4_4_,"edg side");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_swap_same_faceid(REF_GRID ref_grid, REF_INT node0,
                                        REF_INT node1, REF_BOOL *allowed) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT ncell;
  REF_INT cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT id0, id1;
  REF_BOOL has_edg, has_tri, has_qua;

  *allowed = REF_FALSE;

  RSS(ref_cell_has_side(ref_grid_edg(ref_grid), node0, node1, &has_edg),
      "edg side");
  RSS(ref_cell_has_side(ref_grid_tri(ref_grid), node0, node1, &has_tri),
      "tri side");
  RSS(ref_cell_has_side(ref_grid_qua(ref_grid), node0, node1, &has_qua),
      "qua side");
  if (has_edg || (has_tri && has_qua)) {
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }
  RSB(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two", {
        ref_node_location(ref_grid_node(ref_grid), node0);
        ref_node_location(ref_grid_node(ref_grid), node1);
        ref_swap_tattle_nodes(ref_cell, node0, node1);
        ref_export_by_extension(ref_grid, "ref_swap_same_faceid.tec");
      });

  if (0 == ncell) { /* away from boundary */
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }
  REIB(2, ncell, "there should be zero or two triangles for manifold", {
    ref_node_location(ref_grid_node(ref_grid), node0);
    ref_node_location(ref_grid_node(ref_grid), node1);
    ref_export_by_extension(ref_grid, "ref_swap_same_faceid.tec");
  });

  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");
  id0 = nodes[ref_cell_node_per(ref_cell)];
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes tri1");
  id1 = nodes[ref_cell_node_per(ref_cell)];

  if (id0 == id1) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}